

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

void __thiscall amrex::VisMF::VisMF(VisMF *this,string *fafab_name)

{
  Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  *this_00;
  pointer pVVar1;
  element_type *peVar2;
  ulong uVar3;
  ulong uVar4;
  int n;
  long lVar5;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string FullHdrFileName;
  string fileCharPtrString;
  istringstream infs;
  
  std::__cxx11::string::string((string *)this,(string *)fafab_name);
  Header::Header(&this->m_hdr);
  this_00 = &this->m_pa;
  (this->m_pa).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pa).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pa).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&FullHdrFileName,(string *)this);
  std::__cxx11::string::append((char *)&FullHdrFileName);
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  _infs = ParallelDescriptor::m_comm;
  ParallelDescriptor::ReadAndBcastFile(&FullHdrFileName,&fileCharPtr,true,(MPI_Comm *)&infs);
  std::__cxx11::string::string
            ((string *)&fileCharPtrString,
             fileCharPtr.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)&infs);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&infs,(string *)&fileCharPtrString,_S_in);
  amrex::operator>>((istream *)&infs,&this->m_hdr);
  std::
  vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ::resize(&this_00->
            super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           ,(long)(this->m_hdr).m_ncomp);
  for (lVar5 = 0;
      pVVar1 = (this->m_pa).
               super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar5 < ((long)(this->m_pa).
                     super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x18;
      lVar5 = lVar5 + 1) {
    peVar2 = (this->m_hdr).m_ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::resize
              (&pVVar1[lVar5].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,
               ((long)*(pointer *)
                       ((long)&(peVar2->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) -
               *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data) / 0x1c);
    pVVar1 = (this_00->
             super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
             ).
             super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)((long)*(pointer *)
                           ((long)&pVVar1[lVar5].
                                   super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                   .
                                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                           + 8) -
                   *(long *)&pVVar1[lVar5].
                             super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                   ) >> 3;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      *(undefined8 *)
       (*(long *)&(this_00->
                  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                  ).
                  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar5].
                  super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> +
       uVar3 * 8) = 0;
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&infs);
  std::__cxx11::string::~string((string *)&fileCharPtrString);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&fileCharPtr);
  std::__cxx11::string::~string((string *)&FullHdrFileName);
  return;
}

Assistant:

VisMF::VisMF (const std::string &fafab_name)
    :
    m_fafabname(fafab_name)
{
    std::string FullHdrFileName(m_fafabname);

    FullHdrFileName += TheMultiFabHdrFileSuffix;

    Vector<char> fileCharPtr;
    ParallelDescriptor::ReadAndBcastFile(FullHdrFileName, fileCharPtr);
    std::string fileCharPtrString(fileCharPtr.dataPtr());
    std::istringstream infs(fileCharPtrString, std::istringstream::in);

    infs >> m_hdr;

    m_pa.resize(m_hdr.m_ncomp);

    for(int n(0); n < m_pa.size(); ++n) {
        m_pa[n].resize(m_hdr.m_ba.size());

        for(int ii(0), N(m_pa[n].size()); ii < N; ++ii) {
            m_pa[n][ii] = 0;
        }
    }
}